

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityHBMatrix::process(TetrahedralityHBMatrix *this)

{
  value_type vVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  SnapshotManager *this_00;
  Snapshot *pSVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  long *in_RDI;
  __type _Var12;
  double dVar13;
  int j;
  int i;
  int nang;
  int nbors;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int index2;
  int index1;
  int jj;
  int ii;
  int myIndex;
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  myNeighbors;
  RealType q2;
  RealType q1;
  RealType Qk;
  RealType ctheta;
  RealType theta;
  RealType HAdist;
  RealType DHdist;
  RealType DAdist;
  Vector3d uDA;
  Vector3d HA;
  Vector3d DA;
  Vector3d DH;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  RealType cospsi;
  RealType r;
  Vector3d tposition;
  Vector3d dposition;
  Vector3d rkj;
  Vector3d rik;
  Vector3d rk;
  Vector3d rj;
  Vector3d ri;
  Vector3d vec;
  MoleculeIterator mi;
  Molecule *molj;
  Molecule *moli;
  Molecule *mol2;
  Molecule *mol1;
  Molecule *in_stack_ffffffffffffe7a8;
  DumpReader *in_stack_ffffffffffffe7b0;
  __normal_iterator<std::pair<double,_OpenMD::Molecule_*>_*,_std::vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>_>
  in_stack_ffffffffffffe7b8;
  __normal_iterator<std::pair<double,_OpenMD::Molecule_*>_*,_std::vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>_>
  in_stack_ffffffffffffe7c0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe7c8;
  int in_stack_ffffffffffffe7d0;
  int in_stack_ffffffffffffe7d4;
  double in_stack_ffffffffffffe7d8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe7e0;
  Snapshot *in_stack_ffffffffffffe7e8;
  Molecule *in_stack_ffffffffffffe808;
  Vector3d *in_stack_ffffffffffffe828;
  Snapshot *in_stack_ffffffffffffe830;
  double in_stack_ffffffffffffe838;
  DumpReader *in_stack_ffffffffffffe840;
  string *in_stack_ffffffffffffea00;
  SimInfo *in_stack_ffffffffffffea08;
  DumpReader *in_stack_ffffffffffffea10;
  int local_158c;
  int local_1554;
  int local_14a8;
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  local_220;
  value_type local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1f0;
  double local_1e8;
  Snapshot *local_1e0;
  vector<double,_std::allocator<double>_> *local_1d8;
  double local_1d0;
  DumpReader *local_120;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_118;
  Molecule *local_110;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_108;
  double local_100;
  double local_f8;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_30;
  Molecule *local_28;
  Molecule *local_20;
  DumpReader *local_18;
  Molecule *local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_30);
  Vector3<double>::Vector3((Vector3<double> *)0x1d71f9);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7206);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7213);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7220);
  Vector3<double>::Vector3((Vector3<double> *)0x1d722d);
  Vector3<double>::Vector3((Vector3<double> *)0x1d723a);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7247);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7254);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_108);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_118);
  Vector3<double>::Vector3((Vector3<double> *)0x1d727b);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7288);
  Vector3<double>::Vector3((Vector3<double> *)0x1d7295);
  Vector3<double>::Vector3((Vector3<double> *)0x1d72a2);
  Vector3<double>::Vector3((Vector3<double> *)0x1d72af);
  Vector3<double>::Vector3((Vector3<double> *)0x1d72bc);
  Vector3<double>::Vector3((Vector3<double> *)0x1d72c9);
  std::
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ::vector((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
            *)0x1d72d6);
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar2 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1d72fe);
  DumpReader::DumpReader
            (in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,in_stack_ffffffffffffea00);
  iVar4 = DumpReader::getNFrames(in_stack_ffffffffffffe7b0);
  for (local_14a8 = 0; local_14a8 < iVar4; local_14a8 = (int)in_RDI[6] + local_14a8) {
    DumpReader::readFrame(in_stack_ffffffffffffe840,(int)((ulong)in_stack_ffffffffffffe838 >> 0x20))
    ;
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar8 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar8;
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x1d73ec);
    SimInfo::getNGlobalMolecules((SimInfo *)in_RDI[1]);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffe7e0,(size_type)in_stack_ffffffffffffe7d8,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0)
              );
    bVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
    if (bVar3) {
      SelectionEvaluator::evaluate((SelectionEvaluator *)in_stack_ffffffffffffe7e8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                 (SelectionSet *)in_stack_ffffffffffffe7b8._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1d74b3);
    }
    local_10 = SelectionManager::beginSelectedMolecule
                         ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                          (int *)in_stack_ffffffffffffe7b8._M_current);
    while (local_10 != (Molecule *)0x0) {
      iVar5 = Molecule::getGlobalIndex(local_10);
      local_1f8 = 1.0;
      std::
      vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
      ::clear((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
               *)0x1d7595);
      local_18 = (DumpReader *)
                 SimInfo::beginMolecule
                           ((SimInfo *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0)
                            ,(MoleculeIterator *)in_stack_ffffffffffffe7c8);
      while (local_18 != (DumpReader *)0x0) {
        iVar6 = Molecule::getGlobalIndex((Molecule *)local_18);
        if (iVar6 != iVar5) {
          Molecule::getCom(in_stack_ffffffffffffe808);
          Molecule::getCom(in_stack_ffffffffffffe808);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          if (bVar2) {
            Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          }
          local_f8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1d769c);
          if (local_f8 < (double)in_RDI[0xe1]) {
            std::make_pair<double&,OpenMD::Molecule*&>
                      ((double *)in_stack_ffffffffffffe7b0,(Molecule **)in_stack_ffffffffffffe7a8);
            std::
            vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
            ::push_back((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                         *)in_stack_ffffffffffffe7b0,(value_type *)in_stack_ffffffffffffe7a8);
          }
        }
        local_18 = (DumpReader *)
                   SimInfo::nextMolecule
                             ((SimInfo *)
                              CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                              (MoleculeIterator *)in_stack_ffffffffffffe7c8);
      }
      std::
      vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
      ::begin((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
               *)in_stack_ffffffffffffe7a8);
      std::
      vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
      ::end((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
             *)in_stack_ffffffffffffe7a8);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::Molecule*>*,std::vector<std::pair<double,OpenMD::Molecule*>,std::allocator<std::pair<double,OpenMD::Molecule*>>>>>
                (in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8);
      sVar9 = std::
              vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
              ::size(&local_220);
      iVar6 = (int)sVar9;
      iVar7 = (int)((double)(iVar6 * (iVar6 + -1)) * 0.5);
      Molecule::getCom(in_stack_ffffffffffffe808);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                 (Vector3<double> *)in_stack_ffffffffffffe7a8);
      for (local_1554 = 0; vVar1 = local_1f8, local_1554 < iVar6 + -1; local_1554 = local_1554 + 1)
      {
        pvVar10 = std::
                  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                  ::operator[](&local_220,(long)local_1554);
        local_20 = pvVar10->second;
        Molecule::getCom(in_stack_ffffffffffffe808);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                   (Vector3<double> *)in_stack_ffffffffffffe7a8);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
        if (bVar2) {
          Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
        }
        Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
        local_158c = local_1554;
        while (local_158c = local_158c + 1, local_158c < iVar6) {
          pvVar10 = std::
                    vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
                    ::operator[](&local_220,(long)local_158c);
          local_28 = pvVar10->second;
          Molecule::getCom(in_stack_ffffffffffffe808);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                     (Vector3<double> *)in_stack_ffffffffffffe7a8);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          if (bVar2) {
            Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          local_100 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe7c0._M_current,
                                     (Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current);
          vVar1 = local_1f8;
          _Var12 = std::pow<double,int>
                             ((double)in_stack_ffffffffffffe7b0,
                              (int)((ulong)in_stack_ffffffffffffe7a8 >> 0x20));
          local_1f8 = vVar1 - (_Var12 * 9.0) / ((double)iVar7 * 4.0);
        }
      }
      if (0 < iVar7) {
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe9),(long)iVar5)
        ;
        *pvVar11 = vVar1;
      }
      local_10 = SelectionManager::nextSelectedMolecule
                           ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                            (int *)in_stack_ffffffffffffe7b8._M_current);
    }
    local_10 = SelectionManager::beginSelectedMolecule
                         ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                          (int *)in_stack_ffffffffffffe7b8._M_current);
    while (local_10 != (Molecule *)0x0) {
      local_18 = (DumpReader *)
                 SelectionManager::beginSelectedMolecule
                           ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                            (int *)in_stack_ffffffffffffe7b8._M_current);
      while (local_18 != (DumpReader *)0x0) {
        local_110 = (Molecule *)
                    Molecule::beginHBondDonor
                              ((Molecule *)
                               CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                               (iterator *)in_stack_ffffffffffffe7c8);
        while (local_110 != (Molecule *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                     (Vector3<double> *)in_stack_ffffffffffffe7a8);
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                     (Vector3<double> *)in_stack_ffffffffffffe7a8);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
          Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          local_1d8 = (vector<double,_std::allocator<double>_> *)
                      Vector<double,_3U>::length((Vector<double,_3U> *)0x1d7cde);
          in_stack_ffffffffffffe840 =
               (DumpReader *)
               Molecule::beginHBondAcceptor
                         ((Molecule *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                          (iterator *)in_stack_ffffffffffffe7c8);
          local_120 = in_stack_ffffffffffffe840;
          while (local_120 != (DumpReader *)0x0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                       (Vector3<double> *)in_stack_ffffffffffffe7a8);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
            Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
            in_stack_ffffffffffffe838 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1d7dc8);
            local_1d0 = in_stack_ffffffffffffe838;
            if (in_stack_ffffffffffffe838 < (double)in_RDI[0xe2]) {
              OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                                (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                         (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
              in_stack_ffffffffffffe830 =
                   (Snapshot *)Vector<double,_3U>::length((Vector<double,_3U> *)0x1d7e69);
              local_1e0 = in_stack_ffffffffffffe830;
              in_stack_ffffffffffffe828 =
                   (Vector3d *)
                   dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe7c0._M_current,
                                  (Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current);
              local_1f0 = (double)in_stack_ffffffffffffe828 / ((double)local_1d8 * local_1d0);
              dVar13 = acos(local_1f0);
              local_1e8 = (dVar13 * 180.0) / 3.141592653589793;
              if ((local_1e8 < (double)in_RDI[0xe3]) && ((double)local_1e0 < (double)in_RDI[0xe4]))
              {
                iVar5 = Molecule::getGlobalIndex(local_10);
                iVar6 = Molecule::getGlobalIndex((Molecule *)local_18);
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe9),
                                     (long)iVar5);
                local_200 = *pvVar11;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe9),
                                     (long)iVar6);
                local_208 = *pvVar11;
                (**(code **)(*in_RDI + 0x28))(local_200,local_208);
              }
            }
            local_120 = (DumpReader *)
                        Molecule::nextHBondAcceptor
                                  ((Molecule *)
                                   CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                                   (iterator *)in_stack_ffffffffffffe7c8);
          }
          in_stack_ffffffffffffe808 =
               (Molecule *)
               Molecule::nextHBondDonor
                         ((Molecule *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                          (iterator *)in_stack_ffffffffffffe7c8);
          local_110 = in_stack_ffffffffffffe808;
        }
        local_120 = (DumpReader *)
                    Molecule::beginHBondAcceptor
                              ((Molecule *)
                               CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                               (iterator *)in_stack_ffffffffffffe7c8);
        while (local_120 != (DumpReader *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                     (Vector3<double> *)in_stack_ffffffffffffe7a8);
          local_110 = (Molecule *)
                      Molecule::beginHBondDonor
                                ((Molecule *)
                                 CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                                 (iterator *)in_stack_ffffffffffffe7c8);
          while (local_110 != (Molecule *)0x0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                       (Vector3<double> *)in_stack_ffffffffffffe7a8);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
            Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
            local_1d0 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1d8185);
            if (local_1d0 < (double)in_RDI[0xe2]) {
              StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe7b8._M_current);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe7b0,
                         (Vector3<double> *)in_stack_ffffffffffffe7a8);
              OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                                (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                         (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
              in_stack_ffffffffffffe7e8 =
                   (Snapshot *)Vector<double,_3U>::length((Vector<double,_3U> *)0x1d8252);
              local_1e0 = in_stack_ffffffffffffe7e8;
              OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current,
                                (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe7b8._M_current,
                         (Vector<double,_3U> *)in_stack_ffffffffffffe7b0);
              Snapshot::wrapVector(in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
              in_stack_ffffffffffffe7e0 =
                   (vector<double,_std::allocator<double>_> *)
                   Vector<double,_3U>::length((Vector<double,_3U> *)0x1d82ca);
              local_1d8 = in_stack_ffffffffffffe7e0;
              in_stack_ffffffffffffe7d8 =
                   dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe7c0._M_current,
                                  (Vector<double,_3U> *)in_stack_ffffffffffffe7b8._M_current);
              local_1f0 = in_stack_ffffffffffffe7d8 / ((double)local_1d8 * local_1d0);
              dVar13 = acos(local_1f0);
              local_1e8 = (dVar13 * 180.0) / 3.141592653589793;
              if ((local_1e8 < (double)in_RDI[0xe3]) && ((double)local_1e0 < (double)in_RDI[0xe4]))
              {
                iVar5 = Molecule::getGlobalIndex((Molecule *)local_18);
                in_stack_ffffffffffffe7d4 = iVar5;
                iVar6 = Molecule::getGlobalIndex(local_10);
                in_stack_ffffffffffffe7c8 =
                     (vector<double,_std::allocator<double>_> *)(in_RDI + 0xe9);
                in_stack_ffffffffffffe7d0 = iVar6;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (in_stack_ffffffffffffe7c8,(long)iVar5);
                local_200 = *pvVar11;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (in_stack_ffffffffffffe7c8,(long)iVar6);
                local_208 = *pvVar11;
                (**(code **)(*in_RDI + 0x28))(local_200,local_208);
              }
            }
            in_stack_ffffffffffffe7c0._M_current =
                 (pair<double,_OpenMD::Molecule_*> *)
                 Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                            (iterator *)in_stack_ffffffffffffe7c8);
            local_110 = (Molecule *)in_stack_ffffffffffffe7c0._M_current;
          }
          in_stack_ffffffffffffe7b8._M_current =
               (pair<double,_OpenMD::Molecule_*> *)
               Molecule::nextHBondAcceptor
                         ((Molecule *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                          (iterator *)in_stack_ffffffffffffe7c8);
          local_120 = (DumpReader *)in_stack_ffffffffffffe7b8._M_current;
        }
        in_stack_ffffffffffffe7b0 =
             (DumpReader *)
             SelectionManager::nextSelectedMolecule
                       ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                        (int *)in_stack_ffffffffffffe7b8._M_current);
        local_18 = in_stack_ffffffffffffe7b0;
      }
      in_stack_ffffffffffffe7a8 =
           SelectionManager::nextSelectedMolecule
                     ((SelectionManager *)in_stack_ffffffffffffe7c0._M_current,
                      (int *)in_stack_ffffffffffffe7b8._M_current);
      local_10 = in_stack_ffffffffffffe7a8;
    }
  }
  (**(code **)(*in_RDI + 0x18))();
  DumpReader::~DumpReader(in_stack_ffffffffffffe7b0);
  std::
  vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
  ::~vector((vector<std::pair<double,_OpenMD::Molecule_*>,_std::allocator<std::pair<double,_OpenMD::Molecule_*>_>_>
             *)in_stack_ffffffffffffe7c0._M_current);
  return;
}

Assistant:

void TetrahedralityHBMatrix::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* moli;
    Molecule* molj;
    SimInfo::MoleculeIterator mi;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj, dposition, tposition;
    RealType r, cospsi;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta, Qk, q1, q2;
    std::vector<std::pair<RealType, Molecule*>> myNeighbors;
    int myIndex, ii, jj, index1, index2;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Q_.clear();
      Q_.resize(info_->getNGlobalMolecules(), 0.0);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected Molecules:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        myIndex = mol1->getGlobalIndex();

        Qk = 1.0;

        myNeighbors.clear();

        // inner loop is over all Molecules in the system:

        for (mol2 = info_->beginMolecule(mi); mol2 != NULL;
             mol2 = info_->nextMolecule(mi)) {
          if (mol2->getGlobalIndex() != myIndex) {
            vec = mol1->getCom() - mol2->getCom();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, mol2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:
        // int nbors =  myNeighbors.size()> 4 ? 4 : myNeighbors.size();
        int nbors = myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = mol1->getCom();

        for (int i = 0; i < nbors - 1; i++) {
          moli = myNeighbors[i].second;
          ri   = moli->getCom();
          rik  = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            molj = myNeighbors[j].second;
            rj   = molj->getCom();
            rkj  = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from the actual number of nearest neighbors.
            Qk = Qk - (pow(cospsi + 1.0 / 3.0, 2) * 9.0 / (4.0 * nang));
          }
        }

        if (nang > 0) { Q_[myIndex] = Qk; }
      }
      // Now to scan for histogram:

      for (mol1 = seleMan_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan_.nextSelectedMolecule(ii)) {
        for (mol2 = seleMan_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
                 hba = mol2->nextHBondAcceptor(hbai)) {
              aPos = hba->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                HA = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  index1 = mol1->getGlobalIndex();
                  index2 = mol2->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
          // now loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
                 hbd = mol2->nextHBondDonor(hbdi)) {
              dPos = hbd->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < OOCut_) {
                hPos = hbd->donatedHydrogen->getPos();
                HA   = aPos - hPos;
                currentSnapshot_->wrapVector(HA);
                HAdist = HA.length();

                DH = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_ && HAdist < OHCut_) {
                  // We have a hydrogen bond!
                  // keep these indexed by donor then acceptor:
                  index1 = mol2->getGlobalIndex();
                  index2 = mol1->getGlobalIndex();
                  q1     = Q_[index1];
                  q2     = Q_[index2];
                  collectHistogram(q1, q2);
                }
              }
            }
          }
        }
      }
    }
    writeOutput();
  }